

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GetFilesPathsRecursively.h
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* GetFilePathsRecursively
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *path)

{
  string nonTrailingSlashPath;
  string local_70 [32];
  string local_50;
  string local_30 [32];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (path->_M_string_length != 0) {
    std::__cxx11::string::string(local_70,(string *)path);
    if ((path->_M_dataplus)._M_p[path->_M_string_length - 1] == '/') {
      std::__cxx11::string::substr((ulong)local_30,(ulong)path);
      std::__cxx11::string::operator=(local_70,local_30);
      std::__cxx11::string::~string(local_30);
    }
    std::__cxx11::string::string((string *)&local_50,local_70);
    _getFilePathsRecursively(&local_50,__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string(local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> GetFilePathsRecursively(const std::string path) {
    std::vector<std::string> result;

    if (path.empty()){
        return result;
    }

    std::string nonTrailingSlashPath = path;
    if (path[path.size()-1] == '/') {
        nonTrailingSlashPath = path.substr(0, path.size() - 1);
    }

    _getFilePathsRecursively(nonTrailingSlashPath, result);

    return result;
}